

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnImportFunc
          (BinaryReaderIR *this,Index import_index,string_view module_name,string_view field_name,
          Index func_index,Index sig_index)

{
  value_type pFVar1;
  Module *this_00;
  pointer pFVar2;
  reference ppFVar3;
  Location local_128;
  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_108;
  Location local_100;
  Var local_e0;
  string local_98;
  string local_68;
  unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_> local_48;
  unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_> import;
  Index import_index_local;
  BinaryReaderIR *this_local;
  string_view field_name_local;
  string_view module_name_local;
  
  field_name_local.data_ = (char *)field_name.size_;
  this_local = (BinaryReaderIR *)field_name.data_;
  module_name_local.data_ = (char *)module_name.size_;
  field_name_local.size_ = (size_type)module_name.data_;
  import._M_t.super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>._M_t.
  super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
  super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._4_4_ = import_index;
  MakeUnique<wabt::FuncImport>();
  string_view::to_string_abi_cxx11_(&local_68,(string_view *)&field_name_local.size_);
  pFVar2 = std::unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>::operator->
                     (&local_48);
  std::__cxx11::string::operator=
            ((string *)&(pFVar2->super_ImportMixin<(wabt::ExternalKind)0>).super_Import.module_name,
             (string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  string_view::to_string_abi_cxx11_(&local_98,(string_view *)&this_local);
  pFVar2 = std::unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>::operator->
                     (&local_48);
  std::__cxx11::string::operator=
            ((string *)&(pFVar2->super_ImportMixin<(wabt::ExternalKind)0>).super_Import.field_name,
             (string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  pFVar2 = std::unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>::operator->
                     (&local_48);
  (pFVar2->func).decl.has_func_type = true;
  GetLocation(&local_100,this);
  Var::Var(&local_e0,sig_index,&local_100);
  pFVar2 = std::unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>::operator->
                     (&local_48);
  Var::operator=(&(pFVar2->func).decl.type_var,&local_e0);
  Var::~Var(&local_e0);
  ppFVar3 = std::vector<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>::operator[]
                      (&this->module_->func_types,(ulong)sig_index);
  pFVar1 = *ppFVar3;
  pFVar2 = std::unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>::operator->
                     (&local_48);
  FuncSignature::operator=(&(pFVar2->func).decl.sig,&pFVar1->sig);
  this_00 = this->module_;
  GetLocation(&local_128,this);
  MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::FuncImport,std::default_delete<wabt::FuncImport>>,wabt::Location>
            ((wabt *)&local_108,&local_48,&local_128);
  Module::AppendField(this_00,&local_108);
  std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
  ~unique_ptr(&local_108);
  Result::Result((Result *)((long)&module_name_local.size_ + 4),Ok);
  std::unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>::~unique_ptr(&local_48);
  return (Result)module_name_local.size_._4_4_;
}

Assistant:

Result BinaryReaderIR::OnImportFunc(Index import_index,
                                    string_view module_name,
                                    string_view field_name,
                                    Index func_index,
                                    Index sig_index) {
  auto import = MakeUnique<FuncImport>();
  import->module_name = module_name.to_string();
  import->field_name = field_name.to_string();
  import->func.decl.has_func_type = true;
  import->func.decl.type_var = Var(sig_index, GetLocation());
  import->func.decl.sig = module_->func_types[sig_index]->sig;
  module_->AppendField(
      MakeUnique<ImportModuleField>(std::move(import), GetLocation()));
  return Result::Ok;
}